

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O0

Data2D<double> * __thiscall
TasGrid::GridLocalPolynomial::encodeSupportForGPU<2,(TasGrid::TypeOneDRule)40,double>
          (Data2D<double> *__return_storage_ptr__,GridLocalPolynomial *this,MultiIndexSet *work)

{
  int new_num_strips;
  int iVar1;
  int *piVar2;
  double *pdVar3;
  double dVar4;
  int local_3c;
  int j;
  double *s;
  int *p;
  int i;
  MultiIndexSet *work_local;
  GridLocalPolynomial *this_local;
  Data2D<double> *cpu_support;
  
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  new_num_strips = MultiIndexSet::getNumIndexes(work);
  Data2D<double>::Data2D<int,int>(__return_storage_ptr__,iVar1,new_num_strips);
  for (p._0_4_ = 0; iVar1 = MultiIndexSet::getNumIndexes(work), (int)p < iVar1; p._0_4_ = (int)p + 1
      ) {
    piVar2 = MultiIndexSet::getIndex(work,(int)p);
    pdVar3 = Data2D<double>::getStrip(__return_storage_ptr__,(int)p);
    for (local_3c = 0; local_3c < (this->super_BaseCanonicalGrid).num_dimensions;
        local_3c = local_3c + 1) {
      dVar4 = RuleLocal::getSupport<(TasGrid::RuleLocal::erule)4>(piVar2[local_3c]);
      pdVar3[local_3c] = dVar4;
      pdVar3[local_3c] = pdVar3[local_3c] * pdVar3[local_3c];
      if (piVar2[local_3c] < 2) {
        pdVar3[local_3c] = -2.0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<T> encodeSupportForGPU(const MultiIndexSet &work) const{
        Data2D<T> cpu_support(num_dimensions, work.getNumIndexes());
        for(int i=0; i<work.getNumIndexes(); i++){
            const int* p = work.getIndex(i);
            T *s = cpu_support.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (ord == 0){
                    s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::pwc>(p[j]));
                } else {
                    switch(crule) {
                        case rule_localp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp>(p[j]));
                            break;
                        case rule_semilocalp:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::semilocalp>(p[j]));
                            break;
                        case rule_localp0:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localp0>(p[j]));
                            break;
                        case rule_localpb:
                            s[j] = static_cast<T>(RuleLocal::getSupport<RuleLocal::erule::localpb>(p[j]));
                            break;
                    };
                    if (ord == 2) s[j] *= s[j];
                    if ((crule == rule_localp) || (crule == rule_semilocalp)) if (p[j] == 0) s[j] = static_cast<T>(-1.0); // constant function
                    if ((crule == rule_localp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-2.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-3.0);
                    }
                    if ((crule == rule_semilocalp) && (ord == 2)){
                        if (p[j] == 1) s[j] = static_cast<T>(-4.0);
                        else if (p[j] == 2) s[j] = static_cast<T>(-5.0);
                    }
                    if ((crule == rule_localpb) && (ord == 2)){
                        if (p[j] < 2) s[j] = static_cast<T>(-2.0); // linear functions on level 0
                    }
                }
            }
        }
        return cpu_support;
    }